

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseTopLevelItems(Parser *this,ScannedTopLevelItem *item)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  Module *pMVar5;
  pool_ref *ppVar6;
  InputDeclaration *inputDeclaration;
  OutputDeclaration *output;
  Function *f;
  UTF8Reader local_60;
  UTF8Reader local_58;
  UTF8Reader local_50;
  ulong local_48;
  size_t i_2;
  ulong local_38;
  size_t i_1;
  ulong local_28;
  size_t i;
  UTF8Reader nextItemPos;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  nextItemPos.data = (char *)item;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  getCurrentTokeniserPosition
            ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              *)&i);
  for (local_28 = 0; uVar1 = local_28,
      sVar3 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::size
                        ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                         (nextItemPos.data + 0x58)), uVar1 < sVar3; local_28 = local_28 + 1) {
    pvVar4 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::operator[]
                       ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                        (nextItemPos.data + 0x58),local_28);
    UTF8Reader::UTF8Reader((UTF8Reader *)&i_1,pvVar4);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    resetPosition(&this->
                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ,(UTF8Reader *)&i_1);
    pMVar5 = pool_ptr<soul::Module>::operator->(&this->module);
    ppVar6 = (pool_ref *)
             std::
             vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
             ::operator[](&pMVar5->inputs,local_28);
    inputDeclaration = pool_ref::operator_cast_to_InputDeclaration_(ppVar6);
    parseInput(this,inputDeclaration);
  }
  for (local_38 = 0; uVar1 = local_38,
      sVar3 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::size
                        ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                         (nextItemPos.data + 0x70)), uVar1 < sVar3; local_38 = local_38 + 1) {
    pvVar4 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::operator[]
                       ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                        (nextItemPos.data + 0x70),local_38);
    UTF8Reader::UTF8Reader((UTF8Reader *)&i_2,pvVar4);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    resetPosition(&this->
                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ,(UTF8Reader *)&i_2);
    pMVar5 = pool_ptr<soul::Module>::operator->(&this->module);
    ppVar6 = (pool_ref *)
             std::
             vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
             ::operator[](&pMVar5->outputs,local_38);
    output = pool_ref::operator_cast_to_OutputDeclaration_(ppVar6);
    parseOutput(this,output);
  }
  for (local_48 = 0; uVar1 = local_48,
      sVar3 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::size
                        ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                         (nextItemPos.data + 0x28)), uVar1 < sVar3; local_48 = local_48 + 1) {
    pvVar4 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::operator[]
                       ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                        (nextItemPos.data + 0x28),local_48);
    UTF8Reader::UTF8Reader(&local_50);
    bVar2 = UTF8Reader::operator!=(pvVar4,&local_50);
    if (bVar2) {
      pvVar4 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::operator[]
                         ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                          (nextItemPos.data + 0x28),local_48);
      UTF8Reader::UTF8Reader(&local_58,pvVar4);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      resetPosition(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,&local_58);
      pMVar5 = pool_ptr<soul::Module>::operator->(&this->module);
      f = Module::Functions::at(&pMVar5->functions,local_48);
      parseFunctionBody(this,f);
    }
  }
  UTF8Reader::UTF8Reader(&local_60,(UTF8Reader *)&i);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  resetPosition(&this->
                 super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ,&local_60);
  return;
}

Assistant:

void parseTopLevelItems (ScannedTopLevelItem& item)
    {
        auto nextItemPos = getCurrentTokeniserPosition();

        for (size_t i = 0; i < item.inputDecls.size(); ++i)
        {
            resetPosition (item.inputDecls[i]);
            parseInput (module->inputs[i]);
        }

        for (size_t i = 0; i < item.outputDecls.size(); ++i)
        {
            resetPosition (item.outputDecls[i]);
            parseOutput (module->outputs[i]);
        }

        for (size_t i = 0; i < item.functionBodyCode.size(); ++i)
        {
            if (item.functionBodyCode[i] != UTF8Reader())
            {
                resetPosition (item.functionBodyCode[i]);
                parseFunctionBody (module->functions.at (i));
            }
        }

        resetPosition (nextItemPos);
    }